

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

void __thiscall ParameterInfo::ParameterInfo(ParameterInfo *this)

{
  ParameterInfo *this_local;
  
  this->name_length = -1;
  this->group_id = -1;
  this->name = (char *)0x0;
  this->next_offset = -1;
  this->data_type = -1;
  this->n_dimensions = 0xff;
  this->dimensions = (Uint8 *)0x0;
  this->char_data = (char *)0x0;
  this->int_data = (Sint16 *)0x0;
  this->float_data = (float *)0x0;
  this->descr_length = -1;
  this->description = (char *)0x0;
  this->locked = false;
  return;
}

Assistant:

ParameterInfo() :
		name_length(-1),
		group_id(-1),
		name(NULL),
		next_offset(-1),
		data_type(-1),
		n_dimensions(-1),
		dimensions(NULL),

		char_data(NULL),
		int_data(NULL),
		float_data(NULL),

		descr_length(-1),
		description(NULL),
		locked(false)
		{}